

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void memXor(void *dest,void *src1,void *src2,size_t count)

{
  ulong uVar1;
  
  for (; 7 < count; count = count - 8) {
    *(ulong *)dest = *src2 ^ *src1;
    src1 = (void *)((long)src1 + 8);
    src2 = (void *)((long)src2 + 8);
    dest = (void *)((long)dest + 8);
  }
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    *(byte *)((long)dest + uVar1) = *(byte *)((long)src2 + uVar1) ^ *(byte *)((long)src1 + uVar1);
  }
  return;
}

Assistant:

void memXor(void* dest, const void* src1, const void* src2, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src1, dest, count));
	ASSERT(memIsSameOrDisjoint(src2, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest = *(const word*)src1 ^ *(const word*)src2;
		src1 = (const word*)src1 + 1;
		src2 = (const word*)src2 + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest = *(const octet*)src1 ^ *(const octet*)src2;
		src1 = (const octet*)src1 + 1;
		src2 = (const octet*)src2 + 1;
		dest = (octet*)dest + 1;
	}
}